

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrScenePlaneAlignmentFilterInfoMSFT *value)

{
  bool bVar1;
  NextChainResult NVar2;
  XrResult XVar3;
  ulong uVar4;
  uint32_t in_stack_fffffffffffffd2c;
  allocator local_2c9;
  GenValidUsageXrInstanceInfo *local_2c8;
  string *local_2c0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *local_2b8;
  allocator local_2a9;
  string local_2a8;
  string local_288;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_228;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_210;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  string error_message;
  
  XVar3 = XR_SUCCESS;
  local_2c8 = instance_info;
  local_2c0 = command_name;
  local_2b8 = objects_info;
  if (value->type != XR_TYPE_SCENE_PLANE_ALIGNMENT_FILTER_INFO_MSFT) {
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrScenePlaneAlignmentFilterInfoMSFT",
               value->type,"VUID-XrScenePlaneAlignmentFilterInfoMSFT-type-type",
               XR_TYPE_SCENE_PLANE_ALIGNMENT_FILTER_INFO_MSFT,
               "XR_TYPE_SCENE_PLANE_ALIGNMENT_FILTER_INFO_MSFT");
  }
  if (!check_pnext) goto LAB_0016e671;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NVar2 = ValidateNextChain(local_2c8,local_2c0,local_2b8,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar2 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&local_2a8);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_2a8,local_2c8,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::string
              ((string *)&local_2a8,"VUID-XrScenePlaneAlignmentFilterInfoMSFT-next-unique",
               &local_2c9);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1f8,local_2b8);
    std::__cxx11::string::string
              ((string *)&local_288,
               "Multiple structures of the same type(s) in \"next\" chain for XrScenePlaneAlignmentFilterInfoMSFT struct"
               ,&local_2a9);
    CoreValidLogMessage(local_2c8,&local_2a8,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2c0,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1f8,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1f8);
    std::__cxx11::string::~string((string *)&local_2a8);
LAB_0016e63a:
    std::__cxx11::string::~string((string *)&error_message);
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar2 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrScenePlaneAlignmentFilterInfoMSFT-next-next",
               (allocator *)&local_288);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1e0,local_2b8);
    std::__cxx11::string::string
              ((string *)&local_2a8,
               "Invalid structure(s) in \"next\" chain for XrScenePlaneAlignmentFilterInfoMSFT struct \"next\""
               ,&local_2c9);
    CoreValidLogMessage(local_2c8,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2c0,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1e0,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1e0);
    goto LAB_0016e63a;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_0016e671:
  if (!check_members || XVar3 != XR_SUCCESS) {
    return XVar3;
  }
  if (value->alignmentCount == 0) {
    if (value->alignments == (XrScenePlaneAlignmentTypeMSFT *)0x0) {
      return XR_SUCCESS;
    }
  }
  else if (value->alignments == (XrScenePlaneAlignmentTypeMSFT *)0x0) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "VUID-XrScenePlaneAlignmentFilterInfoMSFT-alignments-parameter",
               (allocator *)&local_288);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_210,local_2b8);
    std::__cxx11::string::string
              ((string *)&local_2a8,
               "Structure XrScenePlaneAlignmentFilterInfoMSFT member alignmentCount is NULL, but value->alignmentCount is greater than 0"
               ,(allocator *)&valid_ext_structs);
    CoreValidLogMessage(local_2c8,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2c0,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_210,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_210);
    std::__cxx11::string::~string((string *)&error_message);
    return XR_ERROR_VALIDATION_FAILURE;
  }
  uVar4 = 0;
  do {
    if (value->alignmentCount <= uVar4) {
      return XR_SUCCESS;
    }
    std::__cxx11::string::string
              ((string *)&error_message,"XrScenePlaneAlignmentFilterInfoMSFT",
               (allocator *)&local_288);
    std::__cxx11::string::string((string *)&local_2a8,"alignments",(allocator *)&valid_ext_structs);
    bVar1 = ValidateXrEnum(local_2c8,local_2c0,&error_message,&local_2a8,local_2b8,
                           value->alignments[uVar4]);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&error_message);
    uVar4 = uVar4 + 1;
  } while (bVar1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
  std::operator<<((ostream *)&error_message,
                  "XrScenePlaneAlignmentFilterInfoMSFT contains invalid XrScenePlaneAlignmentTypeMSFT \"alignments\" enum value "
                 );
  Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffd2c);
  std::operator<<((ostream *)&error_message,(string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::string
            ((string *)&local_2a8,"VUID-XrScenePlaneAlignmentFilterInfoMSFT-alignments-parameter",
             (allocator *)&valid_ext_structs);
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             &local_228,local_2b8);
  std::__cxx11::stringbuf::str();
  CoreValidLogMessage(local_2c8,&local_2a8,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2c0,
                      (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                       *)&local_228,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&local_228);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrScenePlaneAlignmentFilterInfoMSFT* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_SCENE_PLANE_ALIGNMENT_FILTER_INFO_MSFT) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrScenePlaneAlignmentFilterInfoMSFT",
                             value->type, "VUID-XrScenePlaneAlignmentFilterInfoMSFT-type-type", XR_TYPE_SCENE_PLANE_ALIGNMENT_FILTER_INFO_MSFT, "XR_TYPE_SCENE_PLANE_ALIGNMENT_FILTER_INFO_MSFT");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrScenePlaneAlignmentFilterInfoMSFT-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrScenePlaneAlignmentFilterInfoMSFT struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrScenePlaneAlignmentFilterInfoMSFT : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrScenePlaneAlignmentFilterInfoMSFT-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrScenePlaneAlignmentFilterInfoMSFT struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Optional array must be non-NULL when value->alignmentCount is non-zero
    if (0 != value->alignmentCount && nullptr == value->alignments) {
        CoreValidLogMessage(instance_info, "VUID-XrScenePlaneAlignmentFilterInfoMSFT-alignments-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrScenePlaneAlignmentFilterInfoMSFT member alignmentCount is NULL, but value->alignmentCount is greater than 0");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->alignments) {
        for (uint32_t value_alignments_inc = 0; value_alignments_inc < value->alignmentCount; ++value_alignments_inc) {
            // Make sure the enum type XrScenePlaneAlignmentTypeMSFT value is valid
            if (!ValidateXrEnum(instance_info, command_name, "XrScenePlaneAlignmentFilterInfoMSFT", "alignments", objects_info, value->alignments[value_alignments_inc])) {
                std::ostringstream oss_enum;
                oss_enum << "XrScenePlaneAlignmentFilterInfoMSFT contains invalid XrScenePlaneAlignmentTypeMSFT \"alignments\" enum value ";
                oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->alignments[value_alignments_inc]));
                CoreValidLogMessage(instance_info, "VUID-XrScenePlaneAlignmentFilterInfoMSFT-alignments-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, oss_enum.str());
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}